

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthRangeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::DepthRangeWriteCase::DepthRangeWriteCase
          (DepthRangeWriteCase *this,Context *context,char *name,char *desc,Vec4 *depthCoord,
          float zNear,float zFar)

{
  float zFar_local;
  float zNear_local;
  Vec4 *depthCoord_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  DepthRangeWriteCase *this_local;
  
  gles2::TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DepthRangeWriteCase_0327c830;
  this->m_depthCoord = depthCoord;
  this->m_zNear = zNear;
  this->m_zFar = zFar;
  return;
}

Assistant:

DepthRangeWriteCase::DepthRangeWriteCase (Context& context, const char* name, const char* desc, const tcu::Vec4& depthCoord, const float zNear, const float zFar)
	: TestCase			(context, name, desc)
	, m_depthCoord		(depthCoord)
	, m_zNear			(zNear)
	, m_zFar			(zFar)
{
}